

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O3

void __thiscall
agge::tests::VectorRasterizerTests::HorizontalLinesDoesNothing(VectorRasterizerTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cell reference [1];
  vector_rasterizer vr;
  cell local_e8;
  string local_d8;
  LocationInfo local_b8;
  vector_rasterizer local_90;
  
  vector_rasterizer::vector_rasterizer(&local_90);
  vector_rasterizer::line(&local_90,0xa00,0xf80,0x4600,0xf80);
  local_e8.cover = 0;
  local_e8.x = 0;
  local_e8.y = 0;
  local_e8.area = 0;
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_b8,&local_d8,0xa3);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_e8,&local_90._cells,&local_b8);
  paVar2 = &local_b8.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  vector_rasterizer::line(&local_90,0xa00,0xd80,0x4600,0xd80);
  vector_rasterizer::line(&local_90,0xb4d,-0x1180,0x1d00,-0x1180);
  vector_rasterizer::line(&local_90,-0xa00,0xd780,-0x4600,0xd780);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_b8,&local_d8,0xab);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_e8,&local_90._cells,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_90._x_sorted_cells._begin != (cell *)0x0) {
    operator_delete__(local_90._x_sorted_cells._begin);
  }
  if (local_90._histogram_x._begin != (uint *)0x0) {
    operator_delete__(local_90._histogram_x._begin);
  }
  if (local_90._histogram_y._begin != (uint *)0x0) {
    operator_delete__(local_90._histogram_y._begin);
  }
  if (local_90._cells._begin != (cell *)0x0) {
    operator_delete__(local_90._cells._begin);
  }
  return;
}

Assistant:

test( HorizontalLinesDoesNothing )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(fp(10.0), fp(15.5), fp(70.0), fp(15.5));

				// ASSERT
				const vector_rasterizer::cell reference[] = {
					{ },
				};

				assert_equal(reference, vr.cells());

				// ACT
				vr.line(fp(10.0), fp(13.5), fp(70.0), fp(13.5));
				vr.line(fp(11.3), fp(-17.5), fp(29.0), fp(-17.5));
				vr.line(fp(-10.0), fp(215.5), fp(-70.0), fp(215.5));

				// ASSERT
				assert_equal(reference, vr.cells());
			}